

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

void __thiscall
QtMWidgets::TableViewSection::TableViewSection(TableViewSection *this,QWidget *parent)

{
  TableViewSectionPrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00194650;
  *(undefined ***)&this->field_0x10 = &PTR__TableViewSection_00194800;
  this_00 = (TableViewSectionPrivate *)operator_new(0x60);
  this_00->_vptr_TableViewSectionPrivate = (_func_int **)&PTR__TableViewSectionPrivate_00196538;
  this_00->q = this;
  this_00->header = (TextLabel *)0x0;
  this_00->footer = (TextLabel *)0x0;
  (this_00->cells).d.d = (Data *)0x0;
  (this_00->cells).d.ptr = (TableViewCell **)0x0;
  (this_00->cells).d.size = 0;
  this_00->layout = (QVBoxLayout *)0x0;
  (this_00->separators).d.d = (Data *)0x0;
  (this_00->separators).d.ptr = (RowsSeparator **)0x0;
  *(undefined8 *)((long)&(this_00->separators).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this_00->separators).d.size + 1) = 0;
  (this->d).d = this_00;
  TableViewSectionPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

TableViewSection::TableViewSection( QWidget * parent )
	:	QWidget( parent )
	,	d( new TableViewSectionPrivate( this ) )
{
	d->init();
}